

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_storage.hpp
# Opt level: O0

void __thiscall
inja::FunctionStorage::add_callback
          (FunctionStorage *this,string_view name,int num_args,CallbackFunction *callback)

{
  Operation local_bc;
  FunctionData local_b8;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  CallbackFunction *local_30;
  CallbackFunction *callback_local;
  FunctionStorage *pFStack_20;
  int num_args_local;
  FunctionStorage *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (FunctionStorage *)name._M_len;
  local_30 = callback;
  callback_local._4_4_ = num_args;
  pFStack_20 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_78,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_79);
  ::std::make_pair<std::__cxx11::string,int&>
            (&local_58,&local_78,(int *)((long)&callback_local + 4));
  local_bc = Callback;
  FunctionData::FunctionData(&local_b8,&local_bc,local_30);
  ::std::
  map<std::pair<std::__cxx11::string,int>,inja::FunctionStorage::FunctionData,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>>>
  ::emplace<std::pair<std::__cxx11::string,int>,inja::FunctionStorage::FunctionData>
            ((map<std::pair<std::__cxx11::string,int>,inja::FunctionStorage::FunctionData,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,inja::FunctionStorage::FunctionData>>>
              *)&this->function_storage,&local_58,&local_b8);
  FunctionData::~FunctionData(&local_b8);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::allocator<char>::~allocator(&local_79);
  return;
}

Assistant:

void add_callback(std::string_view name, int num_args, const CallbackFunction& callback) {
    function_storage.emplace(std::make_pair(static_cast<std::string>(name), num_args), FunctionData {Operation::Callback, callback});
  }